

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

char * __thiscall Assimp::ColladaParser::GetTextContent(ColladaParser *this)

{
  allocator local_39;
  string local_38;
  char *local_18;
  char *sz;
  ColladaParser *this_local;
  
  sz = (char *)this;
  local_18 = TestTextContent(this);
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Invalid contents in element \"n\".",&local_39)
    ;
    ThrowException(this,&local_38);
  }
  return local_18;
}

Assistant:

const char* ColladaParser::GetTextContent()
{
    const char* sz = TestTextContent();
    if (!sz) {
        ThrowException("Invalid contents in element \"n\".");
    }
    return sz;
}